

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O2

string * __thiscall
iutest::PrintToStrings<int,int,int,int,int>
          (string *__return_storage_ptr__,iutest *this,char *separate,int *v,int args,int args_1,
          int args_2,int args_3)

{
  int in_stack_ffffffffffffffb8;
  undefined4 local_44;
  string local_40;
  
  local_44 = SUB84(v,0);
  PrintToString<int>(__return_storage_ptr__,(int *)separate);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  PrintToStrings<int,int,int,int>
            (&local_40,this,(char *)&local_44,(int *)(ulong)(uint)args,args_1,args_2,
             in_stack_ffffffffffffffb8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string PrintToStrings(const char* separate, const T& v, Args... args)
{
    ::std::string str = PrintToString(v);
    str += separate;
    str += PrintToStrings(separate, args...);
    return str;
}